

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

ctmbstr ExpandTilde(TidyDocImpl *doc,ctmbstr filename)

{
  uint uVar1;
  uint uVar2;
  char *__name;
  bool bVar3;
  tmbstr p;
  uint len;
  tmbstr t;
  ctmbstr s;
  passwd *passwd;
  char *home_dir;
  ctmbstr filename_local;
  TidyDocImpl *doc_local;
  
  passwd = (passwd *)0x0;
  if (filename == (ctmbstr)0x0) {
    doc_local = (TidyDocImpl *)0x0;
  }
  else {
    doc_local = (TidyDocImpl *)filename;
    if (*filename == '~') {
      home_dir = filename;
      if (filename[1] == '/') {
        passwd = (passwd *)getenv("HOME");
        if (passwd != (passwd *)0x0) {
          home_dir = filename + 1;
        }
      }
      else {
        s = (ctmbstr)0x0;
        t = filename + 1;
        while( true ) {
          bVar3 = false;
          if (*t != '\0') {
            bVar3 = *t != '/';
          }
          if (!bVar3) break;
          t = t + 1;
        }
        __name = (char *)(*doc->allocator->vtbl->alloc)(doc->allocator,(long)t - (long)filename);
        if (__name != (char *)0x0) {
          memcpy(__name,filename + 1,(size_t)(t + (-1 - (long)filename)));
          __name[(long)(t + (-1 - (long)filename))] = '\0';
          s = (ctmbstr)getpwnam(__name);
          (*doc->allocator->vtbl->free)(doc->allocator,__name);
        }
        if (s != (ctmbstr)0x0) {
          home_dir = t;
          passwd = *(passwd **)(s + 0x20);
        }
      }
      if (passwd == (passwd *)0x0) {
        doc_local = (TidyDocImpl *)home_dir;
      }
      else {
        uVar1 = prvTidytmbstrlen(home_dir);
        uVar2 = prvTidytmbstrlen((ctmbstr)passwd);
        doc_local = (TidyDocImpl *)
                    (*doc->allocator->vtbl->alloc)(doc->allocator,(long)uVar1 + (long)uVar2 + 1);
        prvTidytmbstrcpy((tmbstr)doc_local,(ctmbstr)passwd);
        prvTidytmbstrcat((tmbstr)doc_local,home_dir);
      }
    }
  }
  return (ctmbstr)doc_local;
}

Assistant:

static ctmbstr ExpandTilde( TidyDocImpl* doc, ctmbstr filename )
{
    char *home_dir = NULL;

    if ( !filename )
        return NULL;

    if ( filename[0] != '~' )
        return filename;

    if (filename[1] == '/')
    {
        home_dir = getenv("HOME");
        if (home_dir) {
            ++filename;
        }
#ifdef _WIN32
        else if (strlen(filename) >= 3) {   /* at least '~/+1' */
            /* no HOME env in Windows - got for HOMEDRIVE=C: HOMEPATH=\Users\user */
            char * hd = getenv("HOMEDRIVE");
            char * hp = getenv("HOMEPATH");
            if (hd && hp) {
                ctmbstr s = TidyDocAlloc(doc, _MAX_PATH);
                strcpy(s, hd);
                strcat(s, hp);
                strcat(s, "\\");
                strcat(s, &filename[2]);
                return s;
            }

        }
#endif /* _WIN32 */

    }
#ifdef SUPPORT_GETPWNAM
    else
    {
        struct passwd *passwd = NULL;
        ctmbstr s = filename + 1;
        tmbstr t;

        while ( *s && *s != '/' )
            s++;

        if ( (t = TidyDocAlloc(doc, s - filename)) )
        {
            memcpy(t, filename+1, s-filename-1);
            t[s-filename-1] = 0;

            passwd = getpwnam(t);

            TidyDocFree(doc, t);
        }

        if ( passwd )
        {
            filename = s;
            home_dir = passwd->pw_dir;
        }
    }
#endif /* SUPPORT_GETPWNAM */

    if ( home_dir )
    {
        uint len = TY_(tmbstrlen)(filename) + TY_(tmbstrlen)(home_dir) + 1;
        tmbstr p = (tmbstr)TidyDocAlloc( doc, len );
        TY_(tmbstrcpy)( p, home_dir );
        TY_(tmbstrcat)( p, filename );
        return (ctmbstr) p;
    }
    return (ctmbstr) filename;
}